

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector2D.cpp
# Opt level: O0

ostream * CGL::operator<<(ostream *os,Vector2D *v)

{
  ostream *poVar1;
  double *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  std::operator<<(poVar1,")");
  return in_RDI;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Vector2D& v ) {
    os << "(" << v.x << "," << v.y << ")";
    return os;
  }